

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O1

void __thiscall
libcellml::Annotator::AnnotatorImpl::addIssueNonUnique(AnnotatorImpl *this,string *id)

{
  ulong uVar1;
  IssueImpl *this_00;
  bool bVar2;
  char cVar3;
  long *plVar4;
  size_type __val;
  undefined8 *puVar5;
  ulong *puVar6;
  size_type sVar7;
  size_type *psVar8;
  char cVar9;
  ulong uVar10;
  string __str;
  IssuePtr issue;
  ulong *local_d8;
  uint local_d0;
  undefined4 uStack_cc;
  ulong local_c8 [2];
  long *local_b8;
  undefined8 local_b0;
  long local_a8;
  undefined8 uStack_a0;
  ulong *local_98;
  long local_90;
  ulong local_88;
  long lStack_80;
  IssuePtr local_78;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  Issue::IssueImpl::create();
  this_00 = (local_78.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            mPimpl;
  std::operator+(&local_48,"The identifier \'",id);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_48);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_88 = *puVar6;
    lStack_80 = plVar4[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *puVar6;
    local_98 = (ulong *)*plVar4;
  }
  local_90 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  __val = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>_>_>_>
          ::count(&(this->mIdList)._M_t,id);
  cVar9 = '\x01';
  if (9 < __val) {
    sVar7 = __val;
    cVar3 = '\x04';
    do {
      cVar9 = cVar3;
      if (sVar7 < 100) {
        cVar9 = cVar9 + -2;
        goto LAB_001de642;
      }
      if (sVar7 < 1000) {
        cVar9 = cVar9 + -1;
        goto LAB_001de642;
      }
      if (sVar7 < 10000) goto LAB_001de642;
      bVar2 = 99999 < sVar7;
      sVar7 = sVar7 / 10000;
      cVar3 = cVar9 + '\x04';
    } while (bVar2);
    cVar9 = cVar9 + '\x01';
  }
LAB_001de642:
  local_d8 = local_c8;
  std::__cxx11::string::_M_construct((ulong)&local_d8,cVar9);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_d8,local_d0,__val);
  uVar1 = CONCAT44(uStack_cc,local_d0) + local_90;
  uVar10 = 0xf;
  if (local_98 != &local_88) {
    uVar10 = local_88;
  }
  if (uVar10 < uVar1) {
    uVar10 = 0xf;
    if (local_d8 != local_c8) {
      uVar10 = local_c8[0];
    }
    if (uVar1 <= uVar10) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_98);
      goto LAB_001de6bf;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_d8);
LAB_001de6bf:
  local_b8 = &local_a8;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_a8 = *plVar4;
    uStack_a0 = puVar5[3];
  }
  else {
    local_a8 = *plVar4;
    local_b8 = (long *)*puVar5;
  }
  local_b0 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar8 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_68.field_2._M_allocated_capacity = *psVar8;
    local_68.field_2._8_8_ = plVar4[3];
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  }
  else {
    local_68.field_2._M_allocated_capacity = *psVar8;
    local_68._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_68._M_string_length = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  Issue::IssueImpl::setDescription(this_00,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if (local_d8 != local_c8) {
    operator_delete(local_d8,local_c8[0] + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  Issue::IssueImpl::setLevel
            ((local_78.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             mPimpl,WARNING);
  Issue::IssueImpl::setReferenceRule
            ((local_78.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             mPimpl,ANNOTATOR_ID_NOT_UNIQUE);
  Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&local_78);
  if (local_78.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  return;
}

Assistant:

void Annotator::AnnotatorImpl::addIssueNonUnique(const std::string &id)
{
    auto issue = Issue::IssueImpl::create();
    issue->mPimpl->setDescription("The identifier '" + id + "' occurs " + std::to_string(mIdList.count(id)) + " times in the model so a unique item cannot be located.");
    issue->mPimpl->setLevel(Issue::Level::WARNING);
    issue->mPimpl->setReferenceRule(Issue::ReferenceRule::ANNOTATOR_ID_NOT_UNIQUE);
    addIssue(issue);
}